

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O2

bool __thiscall
jaegertracing::agent::thrift::AgentProcessor::dispatchCall
          (AgentProcessor *this,TProtocol *iprot,TProtocol *oprot,string *fname,int32_t seqid,
          void *callContext)

{
  iterator iVar1;
  ulong __n;
  void *__buf;
  code *pcVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  TApplicationException x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __n = (ulong)(uint)seqid;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::agent::thrift::AgentProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::agent::thrift::AgentProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::agent::thrift::AgentProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
          ::find(&(this->processMap_)._M_t,fname);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->processMap_)._M_t._M_impl.super__Rb_tree_header) {
    (*iprot->_vptr_TProtocol[0x2c])(iprot,0xc);
    (*iprot->_vptr_TProtocol[0x18])(iprot);
    std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> *)
                 &x,&(iprot->ptrans_).
                     super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                );
    (**(code **)(*(long *)x.super_TException._0_8_ + 0x40))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&x.super_TException.message_);
    std::operator+(&local_50,"Invalid method name: \'",fname);
    std::operator+(&local_a0,&local_50,"\'");
    apache::thrift::TApplicationException::TApplicationException(&x,UNKNOWN_METHOD,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_50);
    (*oprot->_vptr_TProtocol[2])(oprot,fname,3);
    apache::thrift::TApplicationException::write(&x,(int)oprot,__buf,__n);
    (*oprot->_vptr_TProtocol[3])(oprot);
    std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_a0,
                 &(oprot->ptrans_).
                  super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                );
    (**(code **)(*(long *)local_a0._M_dataplus._M_p + 0x50))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length);
    std::__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_a0,
                 &(oprot->ptrans_).
                  super___shared_ptr<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                );
    (**(code **)(*(long *)local_a0._M_dataplus._M_p + 0x58))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length);
    apache::thrift::TException::~TException(&x.super_TException);
  }
  else {
    pcVar2 = *(code **)(iVar1._M_node + 2);
    plVar3 = (long *)((long)&(iVar1._M_node[2]._M_parent)->_M_color +
                     (long)&this->super_TDispatchProcessor);
    if (((ulong)pcVar2 & 1) != 0) {
      pcVar2 = *(code **)(pcVar2 + *plVar3 + -1);
    }
    (*pcVar2)(plVar3,__n,iprot,oprot,callContext);
  }
  return true;
}

Assistant:

bool AgentProcessor::dispatchCall(::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol* oprot, const std::string& fname, int32_t seqid, void* callContext) {
  ProcessMap::iterator pfn;
  pfn = processMap_.find(fname);
  if (pfn == processMap_.end()) {
    iprot->skip(::apache::thrift::protocol::T_STRUCT);
    iprot->readMessageEnd();
    iprot->getTransport()->readEnd();
    ::apache::thrift::TApplicationException x(::apache::thrift::TApplicationException::UNKNOWN_METHOD, "Invalid method name: '"+fname+"'");
    oprot->writeMessageBegin(fname, ::apache::thrift::protocol::T_EXCEPTION, seqid);
    x.write(oprot);
    oprot->writeMessageEnd();
    oprot->getTransport()->writeEnd();
    oprot->getTransport()->flush();
    return true;
  }
  (this->*(pfn->second))(seqid, iprot, oprot, callContext);
  return true;
}